

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_padded_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int *in_RSI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  int local_8c;
  int local_88;
  int i_7;
  int j_6;
  float max_value;
  int index_last_element;
  int i_6;
  int j_5;
  int i_5;
  float last_element_in_row;
  int j_4;
  int i_4;
  int j_3;
  float *iimage_data;
  int i_3;
  int j_2;
  int i_2;
  uint32_t row_sum;
  uint32_t *iimage_idata;
  int local_30;
  int i_1;
  int j_1;
  int i;
  int j;
  int border;
  int height;
  int width;
  int data_height;
  int data_width;
  float *iimage_padded_data;
  
  lVar5 = *(long *)(in_RSI + 6);
  iVar2 = in_RSI[4];
  iVar3 = in_RSI[5];
  iVar4 = *in_RSI;
  local_88 = in_RSI[1];
  iVar10 = (iVar2 - iVar4) / 2;
  for (local_30 = 0; iimage_idata._0_4_ = iVar10, local_30 < iVar10; local_30 = local_30 + 1) {
    for (iimage_idata._4_4_ = 0; iimage_idata._4_4_ < iVar2;
        iimage_idata._4_4_ = iimage_idata._4_4_ + 1) {
      in_ZMM0 = ZEXT1664((undefined1  [16])0x0);
      *(undefined4 *)(lVar5 + (long)(local_30 * iVar2 + iimage_idata._4_4_) * 4) = 0;
    }
  }
  for (; (int)iimage_idata < iVar3; iimage_idata._0_4_ = (int)iimage_idata + 1) {
    for (row_sum = 0; (int)row_sum < iVar10; row_sum = row_sum + 1) {
      in_ZMM0 = ZEXT1664((undefined1  [16])0x0);
      *(undefined4 *)(lVar5 + (long)(int)((int)iimage_idata * iVar2 + row_sum) * 4) = 0;
    }
  }
  lVar6 = *(long *)(in_RSI + 2);
  iimage_data._4_4_ = 0;
  for (iimage_data._0_4_ = 0; (int)iimage_data < iVar4; iimage_data._0_4_ = (int)iimage_data + 1) {
    iimage_data._4_4_ = (uint)*(byte *)(in_RDI + (int)iimage_data) + iimage_data._4_4_;
    *(int *)(lVar6 + (long)(int)iimage_data * 4) = iimage_data._4_4_;
  }
  for (j_3 = 1; j_3 < local_88; j_3 = j_3 + 1) {
    iimage_data._4_4_ = 0;
    for (i_4 = 0; i_4 < iVar4; i_4 = i_4 + 1) {
      iimage_data._4_4_ = (uint)*(byte *)(in_RDI + (j_3 * iVar4 + i_4)) + iimage_data._4_4_;
      *(int *)(lVar6 + (long)(j_3 * iVar2 + i_4) * 4) =
           iimage_data._4_4_ + *(int *)(lVar6 + (long)((j_3 + -1) * iVar2 + i_4) * 4);
    }
  }
  lVar7 = *(long *)(in_RSI + 2);
  for (i_5 = 0; i_6 = iVar10, i_5 < local_88; i_5 = i_5 + 1) {
    for (j_5 = 0; j_5 < iVar4; j_5 = j_5 + 1) {
      auVar9 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                                  *(undefined4 *)(lVar6 + (long)(i_5 * iVar2 + j_5) * 4));
      fVar8 = auVar9._0_4_ * 0.003921569;
      in_ZMM0 = ZEXT464((uint)fVar8);
      *(float *)(lVar7 + (long)(i_5 * iVar2 + j_5) * 4) = fVar8;
    }
  }
  for (; i_6 < iVar10 + local_88; i_6 = i_6 + 1) {
    uVar1 = *(undefined4 *)(lVar5 + (long)(i_6 * iVar2 + iVar10 + iVar4 + -1) * 4);
    for (max_value = (float)(iVar4 + iVar10); (int)max_value < iVar2;
        max_value = (float)((int)max_value + 1)) {
      *(undefined4 *)(lVar5 + (long)(i_6 * iVar2 + (int)max_value) * 4) = uVar1;
    }
  }
  for (j_6 = iVar10 + local_88; i_7 = iVar10, j_6 < iVar3; j_6 = j_6 + 1) {
    for (; i_7 < iVar4 + iVar10; i_7 = i_7 + 1) {
      *(undefined4 *)(lVar5 + (long)(j_6 * iVar2 + i_7) * 4) =
           *(undefined4 *)(lVar5 + (long)((j_6 + -1) * iVar2 + i_7) * 4);
    }
  }
  uVar1 = *(undefined4 *)
           (lVar5 + (long)((iVar10 + local_88 + -1) * iVar2 + iVar10 + iVar4 + -1) * 4);
  for (local_88 = iVar10 + local_88; local_88 < iVar3; local_88 = local_88 + 1) {
    for (local_8c = iVar10 + iVar4; local_8c < iVar2; local_8c = local_8c + 1) {
      *(undefined4 *)(lVar5 + (long)(local_88 * iVar2 + local_8c) * 4) = uVar1;
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    float *iimage_padded_data = iimage->padded_data;
   
    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        for (int i = 0; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        for (int i = 0; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        uint32_t row_sum = 0;

        /* sum up the first row */
        for (int i = 0; i < width; ++i) {
            /* previous rows are 0 */
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }

        /* sum all remaining rows*/
        for (int j = 1; j < height; ++j) {
            row_sum = 0;
            for (int i = 0; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                /*add sum of current row until current idx to sum of all previous rows until current index */
                iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
            }
        }

        // Converting uint32_t to floats by casting them and multiplying with (1.0f/255.0f)
        float *iimage_data = iimage->data;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
            }
        }
    
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row = iimage_padded_data[j * data_width + border + width - 1]; // TODO: Check if this is correct
        for (int i = width + border; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row;
        }
    }

    // BLOCK D
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value = iimage_padded_data[index_last_element];
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border + width; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value;
        }
    }

}